

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_tri_surf_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  int local_33c;
  int local_310;
  long local_2d8;
  REF_INT local_2c8;
  long local_2c0;
  long local_2a0;
  long local_270;
  REF_INT local_260;
  long local_258;
  long local_238;
  long local_208;
  REF_INT local_1f8;
  long local_1f0;
  long local_1d0;
  int local_1b0;
  int local_184;
  int local_158;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell;
  REF_INT nnodesg;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_private_macro_code_rss = 3;
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2f,
           "ref_fixture_tri_surf_grid",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  pRVar1->surf = 1;
  local[0x1a] = 0;
  if (0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
    local_158 = 0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_158 = -((ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                 ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  if (ref_mpi->id != local_158) {
    if (1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_184 = 1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_184 = (1 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id != local_184) {
      if (2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
          ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)
         ) {
        local_1b0 = 2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
      }
      else {
        local_1b0 = (2 - (ref_private_macro_code_rss -
                         ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                         ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                    ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                    (ref_private_macro_code_rss -
                    ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
      }
      if (ref_mpi->id != local_1b0) goto LAB_001257ef;
    }
  }
  uVar2 = ref_node_add(ref_node_00,0,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x3f,
           "ref_fixture_tri_surf_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[cell * 0xf] = 0.0;
  ref_node_00->real[cell * 0xf + 1] = 0.0;
  ref_node_00->real[cell * 0xf + 2] = 0.0;
  if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
    local_1d0 = -1;
  }
  else {
    local_1d0 = ref_node_00->global[cell];
  }
  if (local_1d0 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_1f0 = -1;
    }
    else {
      local_1f0 = ref_node_00->global[cell];
    }
    local_1f8 = (REF_INT)(local_1f0 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_208 = -1;
    }
    else {
      local_208 = ref_node_00->global[cell];
    }
    local_1f8 = (int)((local_208 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[cell] = local_1f8;
  uVar2 = ref_node_add(ref_node_00,1,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x40,
           "ref_fixture_tri_surf_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[nnodesg * 0xf] = 1.0;
  ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
  ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
  if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
    local_238 = -1;
  }
  else {
    local_238 = ref_node_00->global[nnodesg];
  }
  if (local_238 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_258 = -1;
    }
    else {
      local_258 = ref_node_00->global[nnodesg];
    }
    local_260 = (REF_INT)(local_258 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_270 = -1;
    }
    else {
      local_270 = ref_node_00->global[nnodesg];
    }
    local_260 = (int)((local_270 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[nnodesg] = local_260;
  uVar2 = ref_node_add(ref_node_00,2,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x41,
           "ref_fixture_tri_surf_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[0] * 0xf] = 0.0;
  ref_node_00->real[local[0] * 0xf + 1] = 1.0;
  ref_node_00->real[local[0] * 0xf + 2] = 0.0;
  if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
    local_2a0 = -1;
  }
  else {
    local_2a0 = ref_node_00->global[local[0]];
  }
  if (local_2a0 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_2c0 = -1;
    }
    else {
      local_2c0 = ref_node_00->global[local[0]];
    }
    local_2c8 = (REF_INT)(local_2c0 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_2d8 = -1;
    }
    else {
      local_2d8 = ref_node_00->global[local[0]];
    }
    local_2c8 = (int)((local_2d8 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[0]] = local_2c8;
  local[1] = 10;
  uVar2 = ref_cell_add(pRVar1->cell[3],&cell,&ref_private_macro_code_rss_1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x43,
           "ref_fixture_tri_surf_grid",(ulong)uVar2,"add tri");
    return uVar2;
  }
LAB_001257ef:
  uVar2 = ref_node_initialize_n_global(ref_node_00,(long)ref_private_macro_code_rss);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x46,
           "ref_fixture_tri_surf_grid",(ulong)uVar2,"init glob");
    return uVar2;
  }
  local[0x1a] = 1;
  if (1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
    local_310 = 1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_310 = (1 - (ref_private_macro_code_rss -
                     ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                     ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  if (ref_mpi->id != local_310) {
    if (2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_33c = 2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_33c = (2 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id != local_33c) {
      return 0;
    }
  }
  uVar2 = ref_node_local(ref_node_00,1,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x4f,
           "ref_fixture_tri_surf_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,2,&nnodesg);
  if (uVar2 == 0) {
    local[1] = 0x14;
    uVar2 = ref_cell_add(pRVar1->cell[0],&cell,&ref_private_macro_code_rss_1);
    if (uVar2 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x52,
           "ref_fixture_tri_surf_grid",(ulong)uVar2,"add edg");
    return uVar2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x50,
         "ref_fixture_tri_surf_grid",(ulong)uVar2,"loc");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri_surf_grid(REF_GRID *ref_grid_ptr,
                                             REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 3;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_surf(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 1;
  global[1] = 2;
  global[3] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}